

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-chunk.c
# Opt level: O2

chunk_conflict * chunk_write(chunk_conflict *c)

{
  bitflag *flags1;
  chunk_conflict *c_00;
  loc lVar1;
  square *psVar2;
  long lVar3;
  int x;
  long lVar4;
  int y;
  long lVar5;
  
  c_00 = cave_new(c->height,c->width);
  for (lVar5 = 0; lVar5 < c_00->height; lVar5 = lVar5 + 1) {
    lVar3 = 0;
    for (lVar4 = 0; lVar4 < c_00->width; lVar4 = lVar4 + 1) {
      x = (int)lVar4;
      y = (int)lVar5;
      lVar1 = (loc)loc(x,y);
      psVar2 = square(c,lVar1);
      (&c_00->squares[lVar5]->feat)[lVar3] = psVar2->feat;
      lVar1 = (loc)loc(x,y);
      psVar2 = square(c_00,lVar1);
      flags1 = psVar2->info;
      lVar1 = (loc)loc(x,y);
      psVar2 = square(c,lVar1);
      flag_copy(flags1,psVar2->info,3);
      lVar3 = lVar3 + 0x28;
    }
  }
  return c_00;
}

Assistant:

struct chunk *chunk_write(struct chunk *c)
{
	int x, y;

	struct chunk *new = cave_new(c->height, c->width);

	/* Write the location stuff */
	for (y = 0; y < new->height; y++) {
		for (x = 0; x < new->width; x++) {
			/* Terrain */
			new->squares[y][x].feat = square(c, loc(x, y))->feat;
			sqinfo_copy(square(new, loc(x, y))->info, square(c, loc(x, y))->info);
		}
	}

	return new;
}